

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

size_t axl::err::setError(StringRef *string)

{
  size_t sVar1;
  Error error;
  
  error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.super_ErrorRef.
  super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p = (ErrorHdr *)0x0;
  error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.super_ErrorRef.
  super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_hdr = (BufHdr *)0x0;
  error.super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>.super_ErrorRef.
  super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_size = 0;
  sVar1 = Error::createStringError(&error,string);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = setError((ErrorRef *)&error);
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&error);
  return sVar1;
}

Assistant:

size_t
setError(const sl::StringRef& string) {
	Error error;
	size_t result = error.createStringError(string);
	return result != -1 ? setError(error) : -1;
}